

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt * __thiscall slang::SVInt::operator-=(SVInt *this,SVInt *rhs)

{
  ulong *puVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  SVInt *pSVar9;
  ulong uVar10;
  bool bVar11;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  uVar8 = (this->super_SVIntStorage).bitWidth;
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar8 != uVar2) {
    if (uVar2 <= uVar8) {
      if (((this->super_SVIntStorage).signFlag == true) &&
         (((rhs->super_SVIntStorage).signFlag & 1U) != 0)) {
        sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      pSVar9 = operator-=(this,(SVInt *)&local_28);
      if ((local_20 < 0x41) && ((local_1b & 1) == 0)) {
        return pSVar9;
      }
      if ((void *)local_28.val == (void *)0x0) {
        return pSVar9;
      }
      operator_delete__(local_28.pVal);
      return pSVar9;
    }
    if (((this->super_SVIntStorage).signFlag == true) &&
       (((rhs->super_SVIntStorage).signFlag & 1U) != 0)) {
      sext((SVInt *)&local_28,(bitwidth_t)this);
    }
    else {
      zext((SVInt *)&local_28,(bitwidth_t)this);
    }
    operator=(this,(SVInt *)&local_28);
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  if (((this->super_SVIntStorage).unknownFlag == false) &&
     ((rhs->super_SVIntStorage).unknownFlag != true)) {
    uVar8 = (this->super_SVIntStorage).bitWidth;
    if (uVar8 < 0x41) {
      (this->super_SVIntStorage).field_0.pVal =
           (uint64_t *)
           ((long)(this->super_SVIntStorage).field_0.pVal - (rhs->super_SVIntStorage).field_0.val);
    }
    else {
      uVar8 = uVar8 + 0x3f;
      if (0x3f < uVar8) {
        puVar3 = (this->super_SVIntStorage).field_0.pVal;
        puVar4 = (rhs->super_SVIntStorage).field_0.pVal;
        uVar10 = 0;
        bVar11 = false;
        do {
          uVar5 = puVar4[uVar10];
          puVar1 = puVar3 + uVar10;
          uVar6 = (ulong)bVar11;
          uVar7 = *puVar1 - uVar5;
          bVar11 = *puVar1 < uVar5 || uVar7 < uVar6;
          *puVar1 = uVar7 - uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar8 >> 6 != uVar10);
      }
    }
    clearUnusedBits(this);
  }
  else {
    setAllX(this);
  }
  return this;
}

Assistant:

SVInt& SVInt::operator-=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, signFlag && rhs.signFlag);
        else
            return *this -= rhs.extend(bitWidth, signFlag && rhs.signFlag);
    }

    if (unknownFlag || rhs.unknownFlag)
        setAllX();
    else {
        if (isSingleWord())
            val -= rhs.val;
        else
            subGeneral(pVal, pVal, rhs.pVal, getNumWords());
        clearUnusedBits();
    }
    return *this;
}